

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.cpp
# Opt level: O2

void __thiscall glu::VarTokenizer::advance(VarTokenizer *this)

{
  char c;
  char *pcVar1;
  Token TVar2;
  bool bVar3;
  int iVar4;
  TestError *this_00;
  int iVar5;
  
  iVar5 = this->m_tokenLen;
  iVar4 = this->m_tokenStart;
  this->m_tokenStart = iVar4 + iVar5;
  this->m_token = TOKEN_LAST;
  this->m_tokenLen = 1;
  pcVar1 = this->m_str;
  c = pcVar1[iVar4 + iVar5];
  if (c == '\0') {
    TVar2 = TOKEN_END;
  }
  else if (c == '.') {
    TVar2 = TOKEN_PERIOD;
  }
  else if (c == '[') {
    TVar2 = TOKEN_LEFT_BRACKET;
  }
  else {
    if (c != ']') {
      if ((byte)(c - 0x30U) < 10) {
        this->m_token = TOKEN_NUMBER;
        iVar4 = iVar4 + iVar5;
        iVar5 = 2;
        while (iVar4 = iVar4 + 1, (byte)(pcVar1[iVar4] - 0x30U) < 10) {
          this->m_tokenLen = iVar5;
          iVar5 = iVar5 + 1;
        }
        return;
      }
      bVar3 = isIdentifierChar(c);
      if (bVar3) {
        this->m_token = TOKEN_IDENTIFIER;
        iVar4 = iVar4 + iVar5;
        iVar5 = 2;
        while( true ) {
          iVar4 = iVar4 + 1;
          bVar3 = isIdentifierChar(pcVar1[iVar4]);
          if (!bVar3) break;
          this->m_tokenLen = iVar5;
          iVar5 = iVar5 + 1;
        }
        return;
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unexpected character",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                 ,0x50);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    TVar2 = TOKEN_RIGHT_BRACKET;
  }
  this->m_token = TVar2;
  return;
}

Assistant:

void VarTokenizer::advance (void)
{
	DE_ASSERT(m_token != TOKEN_END);

	m_tokenStart	+= m_tokenLen;
	m_token			 = TOKEN_LAST;
	m_tokenLen		 = 1;

	if (m_str[m_tokenStart] == '[')
		m_token = TOKEN_LEFT_BRACKET;
	else if (m_str[m_tokenStart] == ']')
		m_token = TOKEN_RIGHT_BRACKET;
	else if (m_str[m_tokenStart] == 0)
		m_token = TOKEN_END;
	else if (m_str[m_tokenStart] == '.')
		m_token = TOKEN_PERIOD;
	else if (isNum(m_str[m_tokenStart]))
	{
		m_token = TOKEN_NUMBER;
		while (isNum(m_str[m_tokenStart+m_tokenLen]))
			m_tokenLen += 1;
	}
	else if (isIdentifierChar(m_str[m_tokenStart]))
	{
		m_token = TOKEN_IDENTIFIER;
		while (isIdentifierChar(m_str[m_tokenStart+m_tokenLen]))
			m_tokenLen += 1;
	}
	else
		TCU_FAIL("Unexpected character");
}